

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.h
# Opt level: O0

FaceIter __thiscall CMU462::HalfedgeMesh::newBoundary(HalfedgeMesh *this)

{
  Face local_e0;
  iterator local_28;
  const_iterator local_20;
  HalfedgeMesh *local_18;
  HalfedgeMesh *this_local;
  
  local_18 = this;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::end(&this->boundaries);
  std::_List_const_iterator<CMU462::Face>::_List_const_iterator(&local_20,&local_28);
  Face::Face(&local_e0,true);
  this_local = (HalfedgeMesh *)
               std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::insert
                         (&this->boundaries,local_20,&local_e0);
  Face::~Face(&local_e0);
  return (FaceIter)(_List_node_base *)this_local;
}

Assistant:

FaceIter newBoundary() {
          return boundaries.insert(boundaries.end(), Face(true));
        }